

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O1

Read<signed_char> __thiscall
Omega_h::mark_down(Omega_h *this,Graph *l2h,Read<signed_char> *high_marked)

{
  Alloc *pAVar1;
  int *piVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  ulong **__dest;
  long *plVar7;
  ulong *puVar8;
  long lVar9;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *pvVar10;
  int size_in;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  Read<signed_char> RVar14;
  ScopedTimer omega_h_scoped_function_timer;
  Write<signed_char> low_marks_w;
  LOs l2lh;
  LOs lh2h;
  size_type __dnew;
  type f;
  ScopedTimer local_159;
  undefined1 local_158 [32];
  Alloc *local_138;
  void *local_130;
  Alloc *local_128;
  void *local_120;
  Write<signed_char> local_118;
  Alloc *local_108;
  void *local_100;
  Alloc *local_f8;
  void *local_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8 [2];
  Write<signed_char> local_c8;
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  long lStack_a0;
  Alloc *local_98;
  void *pvStack_90;
  Alloc *local_88;
  void *pvStack_80;
  Alloc *local_78;
  void *pvStack_70;
  Alloc *local_68;
  void *pvStack_60;
  ulong **local_50;
  ulong *local_48;
  ulong *local_40 [2];
  
  local_108 = (l2h->a2ab).write_.shared_alloc_.alloc;
  if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_108 = (Alloc *)(local_108->size * 8 + 1);
    }
    else {
      local_108->use_count = local_108->use_count + 1;
    }
  }
  local_100 = (l2h->a2ab).write_.shared_alloc_.direct_ptr;
  local_f8 = (l2h->ab2b).write_.shared_alloc_.alloc;
  if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8 = (Alloc *)(local_f8->size * 8 + 1);
    }
    else {
      local_f8->use_count = local_f8->use_count + 1;
    }
  }
  local_f0 = (l2h->ab2b).write_.shared_alloc_.direct_ptr;
  if (((ulong)local_108 & 1) == 0) {
    sVar13 = local_108->size;
  }
  else {
    sVar13 = (ulong)local_108 >> 3;
  }
  local_158._0_8_ = local_158 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"");
  iVar3 = (int)(sVar13 >> 2);
  size_in = iVar3 + -1;
  Write<signed_char>::Write(&local_118,size_in,'\0',(string *)local_158);
  if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
  }
  local_98 = local_108;
  if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98 = (Alloc *)(local_108->size * 8 + 1);
    }
    else {
      local_108->use_count = local_108->use_count + 1;
    }
  }
  pvStack_90 = local_100;
  local_88 = (high_marked->write_).shared_alloc_.alloc;
  if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88 = (Alloc *)(local_88->size * 8 + 1);
    }
    else {
      local_88->use_count = local_88->use_count + 1;
    }
  }
  pvStack_80 = (high_marked->write_).shared_alloc_.direct_ptr;
  local_78 = local_f8;
  if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_78 = (Alloc *)(local_f8->size * 8 + 1);
    }
    else {
      local_f8->use_count = local_f8->use_count + 1;
    }
  }
  pvStack_70 = local_f0;
  local_68 = local_118.shared_alloc_.alloc;
  if (((ulong)local_118.shared_alloc_.alloc & 7) == 0 &&
      local_118.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_68 = (Alloc *)((local_118.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_118.shared_alloc_.alloc)->use_count = (local_118.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pvStack_60 = local_118.shared_alloc_.direct_ptr;
  local_50 = local_40;
  local_e8 = (ulong *)0x5d;
  __dest = (ulong **)std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_e8);
  puVar8 = local_e8;
  local_40[0] = local_e8;
  local_50 = __dest;
  memcpy(__dest,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
         ,0x5d);
  local_48 = puVar8;
  *(undefined1 *)((long)__dest + (long)puVar8) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar8 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar8) {
    local_a8 = *puVar8;
    lStack_a0 = plVar7[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *puVar8;
    local_b8 = (ulong *)*plVar7;
  }
  local_b0 = plVar7[1];
  *plVar7 = (long)puVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct((ulong)&local_e8,'\x02');
  *(undefined2 *)local_e8 = 0x3438;
  uVar11 = 0xf;
  if (local_b8 != &local_a8) {
    uVar11 = local_a8;
  }
  if (uVar11 < (ulong)(local_e0 + local_b0)) {
    uVar11 = 0xf;
    if (local_e8 != local_d8) {
      uVar11 = local_d8[0];
    }
    if ((ulong)(local_e0 + local_b0) <= uVar11) {
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_b8)
      ;
      goto LAB_00313466;
    }
  }
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_e8);
LAB_00313466:
  pAVar1 = (Alloc *)(plVar7 + 2);
  if ((Alloc *)*plVar7 == pAVar1) {
    local_158._16_8_ = pAVar1->size;
    local_158._24_8_ = plVar7[3];
    local_158._0_8_ = (Alloc *)(local_158 + 0x10);
  }
  else {
    local_158._16_8_ = pAVar1->size;
    local_158._0_8_ = (Alloc *)*plVar7;
  }
  local_158._8_8_ = plVar7[1];
  *plVar7 = (long)pAVar1;
  plVar7[1] = 0;
  *(undefined1 *)&pAVar1->size = 0;
  begin_code("parallel_for",(char *)local_158._0_8_);
  if ((Alloc *)local_158._0_8_ != (Alloc *)(local_158 + 0x10)) {
    operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8,local_d8[0] + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,(long)local_40[0] + 1);
  }
  pvVar6 = pvStack_60;
  pvVar5 = pvStack_70;
  pvVar4 = pvStack_80;
  pvVar10 = pvStack_90;
  if (1 < iVar3) {
    local_158._0_8_ = local_98;
    local_158._8_8_ = pvStack_90;
    if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
      local_98->use_count = local_98->use_count + -1;
      local_158._0_8_ = local_98->size * 8 + 1;
    }
    local_98 = (Alloc *)0x0;
    pvStack_90 = (void *)0x0;
    local_158._16_8_ = local_88;
    local_158._24_8_ = pvStack_80;
    if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
      local_88->use_count = local_88->use_count + -1;
      local_158._16_8_ = local_88->size * 8 + 1;
    }
    local_88 = (Alloc *)0x0;
    pvStack_80 = (void *)0x0;
    local_138 = local_78;
    local_130 = pvStack_70;
    if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
      local_78->use_count = local_78->use_count + -1;
      local_138 = (Alloc *)(local_78->size * 8 + 1);
    }
    local_78 = (Alloc *)0x0;
    pvStack_70 = (void *)0x0;
    local_128 = local_68;
    local_120 = pvStack_60;
    if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
      local_68->use_count = local_68->use_count + -1;
      local_128 = (Alloc *)(local_68->size * 8 + 1);
    }
    local_68 = (Alloc *)0x0;
    pvStack_60 = (void *)0x0;
    entering_parallel = '\0';
    lVar9 = 0;
    do {
      iVar3 = *(int *)((long)pvVar10 + lVar9 * 4);
      lVar12 = (long)iVar3;
      if (iVar3 < *(int *)((long)pvVar10 + lVar9 * 4 + 4)) {
        do {
          if (*(char *)((long)pvVar4 + (long)*(int *)((long)pvVar5 + lVar12 * 4)) != '\0') {
            *(undefined1 *)((long)pvVar6 + lVar9) = 1;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < *(int *)((long)pvVar10 + lVar9 * 4 + 4));
      }
      lVar9 = lVar9 + 1;
    } while (size_in != (int)lVar9);
    mark_down(Omega_h::Graph,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)local_158);
  }
  ScopedTimer::~ScopedTimer(&local_159);
  local_c8.shared_alloc_.alloc = local_118.shared_alloc_.alloc;
  local_c8.shared_alloc_.direct_ptr = local_118.shared_alloc_.direct_ptr;
  if ((((ulong)local_118.shared_alloc_.alloc & 7) == 0 &&
       local_118.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_118.shared_alloc_.alloc)->use_count = (local_118.shared_alloc_.alloc)->use_count + -1;
    local_c8.shared_alloc_.alloc = (Alloc *)((local_118.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_118.shared_alloc_.alloc = (Alloc *)0x0;
  local_118.shared_alloc_.direct_ptr = (void *)0x0;
  Read<signed_char>::Read((Read<signed_char> *)this,&local_c8);
  pAVar1 = local_c8.shared_alloc_.alloc;
  if (((ulong)local_c8.shared_alloc_.alloc & 7) == 0 && local_c8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_c8.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_c8.shared_alloc_.alloc);
      operator_delete(pAVar1,0x48);
    }
  }
  mark_down(Omega_h::Graph,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)&local_98);
  pAVar1 = local_118.shared_alloc_.alloc;
  pvVar10 = extraout_RDX;
  if (((ulong)local_118.shared_alloc_.alloc & 7) == 0 &&
      local_118.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_118.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_118.shared_alloc_.alloc);
      operator_delete(pAVar1,0x48);
      pvVar10 = extraout_RDX_00;
    }
  }
  pAVar1 = local_f8;
  if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
    piVar2 = &local_f8->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_f8);
      operator_delete(pAVar1,0x48);
      pvVar10 = extraout_RDX_01;
    }
  }
  pAVar1 = local_108;
  if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
    piVar2 = &local_108->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_108);
      operator_delete(pAVar1,0x48);
      pvVar10 = extraout_RDX_02;
    }
  }
  RVar14.write_.shared_alloc_.direct_ptr = pvVar10;
  RVar14.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar14.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_down(Graph l2h, Read<I8> high_marked) {
  auto l2lh = l2h.a2ab;
  auto lh2h = l2h.ab2b;
  auto nl = l2lh.size() - 1;
  Write<I8> low_marks_w(nl, 0);
  auto f = OMEGA_H_LAMBDA(LO l) {
    for (LO lh = l2lh[l]; lh < l2lh[l + 1]; ++lh)
      if (high_marked[lh2h[lh]]) low_marks_w[l] = 1;
  };
  parallel_for(nl, std::move(f));
  return low_marks_w;
}